

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFObjectParser.cpp
# Opt level: O3

PDFObject * __thiscall PDFObjectParser::ParseDictionary(PDFObjectParser *this)

{
  size_t *psVar1;
  pointer pcVar2;
  bool bVar3;
  EStatusCode EVar4;
  int iVar5;
  _Node *p_Var6;
  PDFObject *pPVar7;
  string *psVar8;
  Trace *pTVar9;
  int iVar10;
  byte bVar11;
  PDFObjectCastPtr<PDFName> aKey;
  string token;
  RefCountPtr<PDFObject> aValue;
  PDFDictionary *local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  RefCountPtr<PDFName> local_90;
  string local_80;
  string local_60;
  RefCountPtr<PDFObject> local_40;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  EVar4 = IncreaseAndCheckDepth(this);
  if (EVar4 == eSuccess) {
    local_b8 = (PDFDictionary *)operator_new(0x78);
    PDFDictionary::PDFDictionary(local_b8);
    iVar10 = 0;
    do {
      bVar3 = GetNextToken(this,&local_80);
      if (!bVar3 || iVar10 != 0) break;
      if (scDoubleRightAngle_abi_cxx11_._M_string_length == local_80._M_string_length) {
        iVar10 = 0;
        bVar11 = 1;
        if ((scDoubleRightAngle_abi_cxx11_._M_string_length == 0) ||
           (iVar5 = bcmp(scDoubleRightAngle_abi_cxx11_._M_dataplus._M_p,local_80._M_dataplus._M_p,
                         scDoubleRightAngle_abi_cxx11_._M_string_length), iVar5 == 0))
        goto LAB_001d1e52;
      }
      p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &this->mTokenBuffer,&local_80);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      psVar1 = &(this->mTokenBuffer).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      pPVar7 = ParseNewObject(this);
      local_90.mValue = PDFObjectCast<PDFName>(pPVar7);
      local_90._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5978;
      if (local_90.mValue == (PDFName *)0x0) {
        pTVar9 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_80);
        Trace::TraceToLog(pTVar9,
                          "PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s"
                          ,local_b0[0]);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        RefCountPtr<PDFName>::~RefCountPtr(&local_90);
        iVar10 = -1;
        break;
      }
      pPVar7 = ParseNewObject(this);
      local_40._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a5870;
      local_40.mValue = pPVar7;
      if (pPVar7 == (PDFObject *)0x0) {
        pTVar9 = Trace::DefaultTrace();
        std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_80);
        Trace::TraceToLog(pTVar9,
                          "PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s"
                          ,local_b0[0]);
        if (local_b0[0] != local_a0) {
          operator_delete(local_b0[0],local_a0[0] + 1);
        }
        iVar10 = -1;
      }
      else {
        psVar8 = PDFName::GetValue_abi_cxx11_(local_90.mValue);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        pcVar2 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_60,pcVar2,pcVar2 + psVar8->_M_string_length);
        bVar3 = PDFDictionary::Exists(local_b8,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        iVar10 = 0;
        if (!bVar3) {
          PDFDictionary::Insert(local_b8,local_90.mValue,local_40.mValue);
        }
      }
      RefCountPtr<PDFObject>::~RefCountPtr(&local_40);
      RefCountPtr<PDFName>::~RefCountPtr(&local_90);
    } while (pPVar7 != (PDFObject *)0x0);
    bVar11 = 0;
LAB_001d1e52:
    EVar4 = DecreaseAndCheckDepth(this);
    if ((bool)(bVar11 & (EVar4 == eSuccess && iVar10 == 0))) goto LAB_001d1c02;
    (*(local_b8->super_PDFObject).super_RefCountObject._vptr_RefCountObject[1])();
    pTVar9 = Trace::DefaultTrace();
    std::__cxx11::string::substr((ulong)local_b0,(ulong)&local_80);
    Trace::TraceToLog(pTVar9,
                      "PDFObjectParser::ParseDictionary, failure to parse dictionary, didn\'t find end of array or failure to parse dictionary member object. token = %s"
                      ,local_b0[0]);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0],local_a0[0] + 1);
    }
  }
  local_b8 = (PDFDictionary *)0x0;
LAB_001d1c02:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return &local_b8->super_PDFObject;
}

Assistant:

PDFObject* PDFObjectParser::ParseDictionary()
{
	PDFDictionary* aDictionary;
	bool dictionaryEndEncountered = false;
	std::string token;
	EStatusCode status = PDFHummus::eSuccess;

	if(IncreaseAndCheckDepth() != eSuccess)
		return NULL;

	aDictionary = new PDFDictionary();

	while(GetNextToken(token) && PDFHummus::eSuccess == status)
	{
		dictionaryEndEncountered = (scDoubleRightAngle == token);
		if(dictionaryEndEncountered)
			break;

		ReturnTokenToBuffer(token);

		// Parse Key
		PDFObjectCastPtr<PDFName> aKey(ParseNewObject());
		if(!aKey)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse key for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}


		// Parse Value
		RefCountPtr<PDFObject> aValue = ParseNewObject();
		if(!aValue)
		{
			status = PDFHummus::eFailure;
			TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse value for a dictionary. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
			break;
		}
	

		// all good. i'm gonna be forgiving here and allow skipping duplicate keys. cause it happens
		if(!aDictionary->Exists(aKey->GetValue()))
			aDictionary->Insert(aKey.GetPtr(),aValue.GetPtr());
	}

	if(DecreaseAndCheckDepth() != eSuccess)
		status = eFailure;
		
	if(dictionaryEndEncountered && PDFHummus::eSuccess == status)
	{
		return aDictionary;
	}
	else
	{
		delete aDictionary;
		TRACE_LOG1("PDFObjectParser::ParseDictionary, failure to parse dictionary, didn't find end of array or failure to parse dictionary member object. token = %s",token.substr(0, MAX_TRACE_SIZE - 200).c_str());
		return NULL;
	}
}